

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O2

void ay8910_write(void *chip,UINT8 addr,UINT8 data)

{
  if ((addr & 1) == 0) {
    *(bool *)((long)chip + 0xe) = data < 0x10;
    if (data < 0x10) {
      *(UINT8 *)((long)chip + 0xf) = data;
    }
  }
  else if (*(char *)((long)chip + 0xe) != '\0') {
    ay8910_write_reg((ay8910_context *)chip,*(UINT8 *)((long)chip + 0xf),data);
    return;
  }
  return;
}

Assistant:

void ay8910_write(void *chip, UINT8 addr, UINT8 data)
{
	ay8910_context *psg = (ay8910_context *)chip;

	if (addr & 1)
	{
		if (psg->active)
		{
			/* Data port */
			ay8910_write_reg(psg, psg->register_latch, data);
		}
	}
	else
	{
		psg->active = (data >> 4) == 0; // mask programmed 4-bit code
		if (psg->active)
		{
			/* Register port */
			psg->register_latch = data & 0x0f;
		}
		else
		{
			logerror("warning - %s upper address mismatch\n", "AY8910");
		}
	}
}